

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O0

int blake2s(void *out,size_t outlen,void *in,size_t inlen,void *key,size_t keylen)

{
  int iVar1;
  undefined1 local_c8 [8];
  blake2s_state S [1];
  size_t keylen_local;
  void *key_local;
  size_t inlen_local;
  void *in_local;
  size_t outlen_local;
  void *out_local;
  
  if ((in == (void *)0x0) && (inlen != 0)) {
    out_local._4_4_ = -1;
  }
  else if (out == (void *)0x0) {
    out_local._4_4_ = -1;
  }
  else if ((key == (void *)0x0) && (keylen != 0)) {
    out_local._4_4_ = -1;
  }
  else if ((outlen == 0) || (0x20 < outlen)) {
    out_local._4_4_ = -1;
  }
  else if (keylen < 0x21) {
    S[0]._128_8_ = keylen;
    if (keylen == 0) {
      iVar1 = blake2s_init((blake2s_state *)local_c8,outlen);
      if (iVar1 < 0) {
        return -1;
      }
    }
    else {
      iVar1 = blake2s_init_key((blake2s_state *)local_c8,outlen,key,keylen);
      if (iVar1 < 0) {
        return -1;
      }
    }
    blake2s_update((blake2s_state *)local_c8,in,inlen);
    blake2s_final((blake2s_state *)local_c8,out,outlen);
    out_local._4_4_ = 0;
  }
  else {
    out_local._4_4_ = -1;
  }
  return out_local._4_4_;
}

Assistant:

int blake2s( void *out, size_t outlen, const void *in, size_t inlen, const void *key, size_t keylen )
{
  blake2s_state S[1];

  /* Verify parameters */
  if ( NULL == in && inlen > 0 ) return -1;

  if ( NULL == out ) return -1;

  if ( NULL == key && keylen > 0) return -1;

  if( !outlen || outlen > BLAKE2S_OUTBYTES ) return -1;

  if( keylen > BLAKE2S_KEYBYTES ) return -1;

  if( keylen > 0 )
  {
    if( blake2s_init_key( S, outlen, key, keylen ) < 0 ) return -1;
  }
  else
  {
    if( blake2s_init( S, outlen ) < 0 ) return -1;
  }

  blake2s_update( S, ( const uint8_t * )in, inlen );
  blake2s_final( S, out, outlen );
  return 0;
}